

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O2

QByteArray *
QRestReplyPrivate::contentCharset(QByteArray *__return_storage_ptr__,QNetworkReply *reply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char *pcVar3;
  QByteArrayView data;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  qsizetype qVar4;
  qsizetype qVar5;
  storage_type *psVar6;
  qsizetype qVar7;
  storage_type *psVar8;
  undefined1 *puVar9;
  char __c;
  int iVar10;
  undefined1 *puVar11;
  long in_FS_OFFSET;
  QLatin1StringView other;
  undefined1 *local_170;
  QArrayDataPointer<char> local_168;
  QLatin1String local_148;
  undefined1 *local_138;
  char *pcStack_130;
  undefined1 *local_128;
  char *pcStack_120;
  R_conflict7 local_118;
  R_conflict7 local_f8;
  QByteArrayView local_d8;
  R_conflict7 local_c8;
  R_conflict7 local_a8;
  QByteArrayView local_88;
  R_conflict4 r;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_168.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)&local_148);
  r.type = (QLatin1StringView)
           QHttpHeaders::value((QHttpHeaders *)&local_148,ContentType,(QByteArrayView)ZEXT816(0));
  QByteArrayView::toByteArray((QByteArray *)&local_168,(QByteArrayView *)&r);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_148);
  r.charset.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  r.charset.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  r.charset._M_dataplus._M_p = &DAT_aaaaaaaaaaaaaaaa;
  r.charset._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  r.subtype.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  r.subtype.m_data = &DAT_aaaaaaaaaaaaaaaa;
  r.type.m_data = &DAT_aaaaaaaaaaaaaaaa;
  r.type.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.m_size = local_168.size;
  local_d8.m_data = local_168.ptr;
  eat_CWS(&local_d8);
  local_f8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_f8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
  data.m_data = local_d8.m_data;
  data.m_size = local_d8.m_size;
  parse_token(&local_f8,data);
  qVar5 = local_f8.token.m_size;
  if ((undefined1 *)local_f8.token.m_size != (undefined1 *)0x0) {
    local_d8.m_size = local_f8.tail.m_size;
    local_d8.m_data = local_f8.tail.m_data;
    eat_CWS(&local_d8);
    if (((undefined1 *)local_d8.m_size != (undefined1 *)0x0) && (*local_d8.m_data == '/')) {
      local_d8.m_data = local_d8.m_data + 1;
      local_d8.m_size = local_d8.m_size + -1;
      eat_CWS(&local_d8);
      local_118.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_118.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
      data_00.m_data = local_d8.m_data;
      data_00.m_size = local_d8.m_size;
      parse_token(&local_118,data_00);
      qVar4 = local_118.token.m_size;
      paVar1 = &r.charset.field_2;
      if ((undefined1 *)local_118.token.m_size != (undefined1 *)0x0) {
        local_d8.m_size = local_118.tail.m_size;
        local_d8.m_data = local_118.tail.m_data;
        eat_CWS(&local_d8);
        r.charset.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        r.type.m_data = local_f8.token.m_data;
        r.type.m_size = qVar5;
        r.subtype.m_size = qVar4;
        r.subtype.m_data = local_118.token.m_data;
        r.charset._M_string_length = 0;
        r.charset.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
        r.charset._M_dataplus._M_p = (pointer)paVar1;
        do {
          if (((undefined1 *)local_d8.m_size == (undefined1 *)0x0) || (*local_d8.m_data != ';'))
          goto LAB_00209613;
          local_d8.m_data = local_d8.m_data + 1;
          local_d8.m_size = local_d8.m_size + -1;
          eat_CWS(&local_d8);
          psVar6 = local_d8.m_data;
          qVar5 = local_d8.m_size;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          pcStack_120 = &DAT_aaaaaaaaaaaaaaaa;
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          pcStack_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_148.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_148.m_data = &DAT_aaaaaaaaaaaaaaaa;
          data_01.m_data = local_d8.m_data;
          data_01.m_size = local_d8.m_size;
          local_a8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
          local_a8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
          parse_token(&local_a8,data_01);
          qVar4 = local_a8.token.m_size;
          if ((undefined1 *)local_a8.token.m_size == (undefined1 *)0x0) {
LAB_002093ba:
            local_138 = (undefined1 *)0x0;
            pcStack_130 = (char *)0x0;
            local_148.m_size = 0;
            local_148.m_data = (pointer)0x0;
            local_128 = (undefined1 *)qVar5;
            pcStack_120 = psVar6;
          }
          else {
            local_88.m_size = local_a8.tail.m_size;
            local_88.m_data = local_a8.tail.m_data;
            eat_CWS(&local_88);
            if (((undefined1 *)local_88.m_size == (undefined1 *)0x0) || (*local_88.m_data != '='))
            goto LAB_002093ba;
            local_88.m_data = local_88.m_data + 1;
            local_88.m_size = local_88.m_size + -1;
            eat_CWS(&local_88);
            psVar8 = local_88.m_data;
            qVar7 = local_88.m_size;
            pcVar3 = local_88.m_data;
            data_02.m_data = local_88.m_data;
            data_02.m_size = local_88.m_size;
            if (((undefined1 *)local_88.m_size == (undefined1 *)0x0) || (*local_88.m_data != '\"'))
            {
              local_c8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
              local_c8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
              parse_token(&local_c8,data_02);
              if ((undefined1 *)local_c8.token.m_size == (undefined1 *)0x0) {
                local_138 = (undefined1 *)0x0;
                pcStack_130 = (char *)0x0;
                local_128 = (undefined1 *)qVar5;
                pcStack_120 = psVar6;
                local_148.m_size = 0;
                local_148.m_data = (pointer)0x0;
              }
              else {
                local_138 = (undefined1 *)local_c8.token.m_size;
                pcStack_130 = local_c8.token.m_data;
                local_128 = (undefined1 *)local_c8.tail.m_size;
                pcStack_120 = local_c8.tail.m_data;
                local_148.m_size = qVar4;
                local_148.m_data = local_a8.token.m_data;
              }
            }
            else {
              puVar9 = (undefined1 *)0x1;
LAB_0020945d:
              puVar11 = puVar9;
              if ((long)puVar11 < qVar7) {
                local_170 = puVar11 + 1;
                __c = psVar8[(long)puVar11];
                if (__c == '\\') goto LAB_00209483;
                if (__c != '\"') goto LAB_00209498;
                if (local_170 != (undefined1 *)0x0) {
                  local_128 = (undefined1 *)(qVar7 + -(long)local_170);
                  pcStack_120 = psVar8 + (long)local_170;
                  local_148.m_size = qVar4;
                  local_148.m_data = local_a8.token.m_data;
                  local_138 = local_170;
                  pcStack_130 = pcVar3;
                  local_88.m_size = (qsizetype)local_128;
                  local_88.m_data = pcStack_120;
                  goto LAB_002093d1;
                }
              }
              local_138 = (undefined1 *)0x0;
              pcStack_130 = (char *)0x0;
              local_148.m_size = 0;
              local_148.m_data = (pointer)0x0;
              local_128 = (undefined1 *)qVar5;
              pcStack_120 = psVar6;
            }
          }
LAB_002093d1:
          other.m_data = "charset";
          other.m_size = 7;
          iVar10 = QLatin1String::compare(&local_148,other,CaseInsensitive);
          if (iVar10 == 0) goto LAB_002095e4;
          r.charset._M_string_length = 0;
          *r.charset._M_dataplus._M_p = '\0';
          if (local_128 == (undefined1 *)qVar5) goto LAB_00209613;
          local_d8.m_size = (qsizetype)local_128;
          local_d8.m_data = pcStack_120;
          eat_CWS(&local_d8);
        } while( true );
      }
      r.subtype.m_size = 0;
      r.subtype.m_data = (char *)0x0;
      r.type = (QLatin1StringView)ZEXT816(0);
      r.charset._M_string_length = 0;
      r.charset.field_2._M_allocated_capacity =
           r.charset.field_2._M_allocated_capacity & 0xffffffffffffff00;
      r.charset._M_dataplus._M_p = (pointer)paVar1;
      goto LAB_0020955e;
    }
  }
  r.charset._M_dataplus._M_p = (pointer)&r.charset.field_2;
  r.subtype.m_size = 0;
  r.subtype.m_data = (char *)0x0;
  r.type = (QLatin1StringView)ZEXT816(0);
  r.charset._M_string_length = 0;
  r.charset.field_2._M_allocated_capacity =
       r.charset.field_2._M_allocated_capacity & 0xffffffffffffff00;
  goto LAB_0020955e;
LAB_00209483:
  puVar9 = (undefined1 *)qVar7;
  if ((undefined1 *)qVar7 != local_170) {
    __c = psVar8[(long)(puVar11 + 1)];
    local_170 = puVar11 + 2;
LAB_00209498:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&r.charset,1,__c);
    puVar9 = local_170;
  }
  goto LAB_0020945d;
LAB_002095e4:
  if ((r.charset._M_string_length == 0) &&
     ((local_138 == (undefined1 *)0x0 || (*pcStack_130 != '\"')))) {
    std::__cxx11::string::assign<char_const*,void>
              ((string *)&r.charset,pcStack_130,pcStack_130 + (long)local_138);
  }
LAB_00209613:
  if ((r.type.m_size != 0) && (r.charset._M_string_length != 0)) {
    local_148.m_size = r.charset._M_string_length;
    local_148.m_data = r.charset._M_dataplus._M_p;
    QByteArrayView::toByteArray(__return_storage_ptr__,(QByteArrayView *)&local_148);
    goto LAB_00209570;
  }
LAB_0020955e:
  Qt::Literals::StringLiterals::operator____ba(__return_storage_ptr__,"UTF-8",5);
LAB_00209570:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
            (&r.charset);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_168);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QRestReplyPrivate::contentCharset(const QNetworkReply* reply)
{
    // Content-type consists of mimetype and optional parameters, of which one may be 'charset'
    // Example values and their combinations below are all valid, see RFC 7231 section 3.1.1.5
    // and RFC 2045 section 5.1
    //
    // text/plain; charset=utf-8
    // text/plain; charset=utf-8;version=1.7
    // text/plain; charset = utf-8
    // text/plain; charset ="utf-8"

    const QByteArray contentTypeValue =
            reply->headers().value(QHttpHeaders::WellKnownHeader::ContentType).toByteArray();

    const auto r = parse_content_type(contentTypeValue);
    if (r && !r.charset.empty())
        return QByteArrayView(r.charset).toByteArray();
    else
        return "UTF-8"_ba; // Default to the most commonly used UTF-8.
}